

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::Errors::RBDLDofMismatchError::RBDLDofMismatchError
          (RBDLDofMismatchError *this,string *text)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)text);
  RBDLError::RBDLError(&this->super_RBDLError,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_RBDLError = &PTR__RBDLError_0027c9a0;
  return;
}

Assistant:

RBDLDofMismatchError::RBDLDofMismatchError(std::string text): RBDLError(text) {}